

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnATM.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnATM::updateBeta
          (VariationalBayesEstimatorOnATM *this,BetaUpdateManner manner)

{
  longdouble lVar1;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_RCX;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  integral_constant<int,_53> *in_RDX;
  integral_constant<int,_53> *extraout_RDX;
  integral_constant<int,_53> *extraout_RDX_00;
  integral_constant<int,_53> *extraout_RDX_01;
  integral_constant<int,_53> *extraout_RDX_02;
  integral_constant<int,_53> *extraout_RDX_03;
  integral_constant<int,_53> *extraout_RDX_04;
  integral_constant<int,_53> *extraout_RDX_05;
  integral_constant<int,_53> *extraout_RDX_06;
  integral_constant<int,_53> *extraout_RDX_07;
  integral_constant<int,_53> *extraout_RDX_08;
  integral_constant<int,_53> *extraout_RDX_09;
  integral_constant<int,_53> *extraout_RDX_10;
  integral_constant<int,_53> *extraout_RDX_11;
  integral_constant<int,_53> *extraout_RDX_12;
  integral_constant<int,_53> *piVar2;
  integral_constant<int,_53> *extraout_RDX_13;
  integral_constant<int,_53> *extraout_RDX_14;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble in_ST5;
  double dVar9;
  double dVar10;
  double dVar11;
  double commonBeta;
  double local_108;
  undefined2 uStack_100;
  double local_f8;
  double local_e0;
  ulong local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (manner == SYMMETRY) {
    if (this->_K == 0) {
      local_108 = NAN;
    }
    else {
      dVar10 = 0.0;
      uVar4 = 0;
      lVar6 = (longdouble)1.79769313486232e+308;
      dVar9 = 0.0;
      do {
        _local_108 = CONCAT28(uStack_100,dVar9);
        local_d8 = uVar4;
        if (this->_V != 0) {
          uVar5 = 0;
          do {
            in_RCX = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                       **)&(this->_nkv).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
            local_88 = *(double *)(in_RCX + uVar5 * 8) +
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar5];
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_e0,(longdouble)local_88,in_RDX,in_RCX);
            dVar9 = 0.0;
            piVar2 = extraout_RDX_03;
            lVar7 = in_ST1;
            lVar1 = in_ST3;
            if (lVar6 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar9 = (double)in_ST0;
              piVar2 = extraout_RDX_04;
              lVar7 = in_ST1;
              lVar1 = in_ST3;
              local_90 = dVar9;
            }
            in_ST3 = in_ST5;
            in_ST1 = lVar1;
            local_98 = (double)in_ST0;
            if (ABS(in_ST0) <= lVar6) {
              dVar9 = local_98;
            }
            lVar8 = in_ST3;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_e0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar5],piVar2,in_RCX);
            dVar11 = 0.0;
            in_RDX = extraout_RDX_05;
            in_ST0 = in_ST2;
            lVar1 = in_ST4;
            if (lVar6 < ABS(lVar7)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar11 = (double)lVar7;
              in_RDX = extraout_RDX_06;
              in_ST0 = in_ST2;
              lVar1 = in_ST4;
              local_a0 = dVar11;
            }
            in_ST4 = lVar8;
            in_ST2 = lVar1;
            local_a8 = (double)lVar7;
            if (ABS(lVar7) <= lVar6) {
              dVar11 = local_a8;
            }
            _local_108 = CONCAT28(uStack_100,
                                  local_108 +
                                  (dVar9 - dVar11) *
                                  (this->_beta).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar5]);
            uVar5 = uVar5 + 1;
            in_ST5 = in_ST4;
          } while (uVar5 < this->_V);
        }
        uVar4 = local_d8;
        local_b0 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_d8] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)local_b0,in_RDX,in_RCX);
        dVar9 = 0.0;
        piVar2 = extraout_RDX_07;
        lVar7 = in_ST1;
        lVar1 = in_ST3;
        if (lVar6 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar9 = (double)in_ST0;
          piVar2 = extraout_RDX_08;
          lVar7 = in_ST1;
          lVar1 = in_ST3;
          local_b8 = dVar9;
        }
        in_ST3 = in_ST5;
        in_ST1 = lVar1;
        local_c0 = (double)in_ST0;
        if (ABS(in_ST0) <= lVar6) {
          dVar9 = local_c0;
        }
        lVar8 = in_ST3;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)this->_betaSum,piVar2,in_RCX);
        dVar11 = 0.0;
        in_RDX = extraout_RDX_09;
        in_ST0 = in_ST2;
        lVar1 = in_ST4;
        if (lVar6 < ABS(lVar7)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar11 = (double)lVar7;
          in_RDX = extraout_RDX_10;
          in_ST0 = in_ST2;
          lVar1 = in_ST4;
          local_c8 = dVar11;
        }
        in_ST4 = lVar8;
        in_ST2 = lVar1;
        local_d0 = (double)lVar7;
        if (ABS(lVar7) <= lVar6) {
          dVar11 = local_d0;
        }
        dVar10 = dVar10 + (dVar9 - dVar11);
        uVar4 = uVar4 + 1;
        in_ST5 = in_ST4;
        dVar9 = local_108;
      } while (uVar4 < this->_K);
      local_108 = local_108 / dVar10;
    }
    local_e0 = local_108 / (double)this->_V;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->_beta,(ulong)this->_V,&local_e0);
  }
  else {
    if (this->_K == 0) {
      local_f8 = 0.0;
    }
    else {
      local_f8 = 0.0;
      uVar4 = 0;
      lVar6 = (longdouble)1.79769313486232e+308;
      do {
        local_38 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)local_38,in_RDX,in_RCX);
        dVar9 = 0.0;
        piVar2 = extraout_RDX;
        lVar7 = in_ST1;
        lVar1 = in_ST3;
        if (lVar6 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar9 = (double)in_ST0;
          piVar2 = extraout_RDX_00;
          lVar7 = in_ST1;
          lVar1 = in_ST3;
          local_40 = dVar9;
        }
        in_ST3 = in_ST5;
        in_ST1 = lVar1;
        local_48 = (double)in_ST0;
        if (ABS(in_ST0) <= lVar6) {
          dVar9 = local_48;
        }
        lVar8 = in_ST3;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_e0,(longdouble)this->_betaSum,piVar2,in_RCX);
        dVar10 = 0.0;
        in_RDX = extraout_RDX_01;
        in_ST0 = in_ST2;
        lVar1 = in_ST4;
        if (lVar6 < ABS(lVar7)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          dVar10 = (double)lVar7;
          in_RDX = extraout_RDX_02;
          in_ST0 = in_ST2;
          lVar1 = in_ST4;
          local_50 = dVar10;
        }
        in_ST4 = lVar8;
        in_ST2 = lVar1;
        local_58 = (double)lVar7;
        if (ABS(lVar7) <= lVar6) {
          dVar10 = local_58;
        }
        local_f8 = local_f8 + (dVar9 - dVar10);
        uVar4 = uVar4 + 1;
        in_ST5 = in_ST4;
      } while (uVar4 < this->_K);
    }
    if (this->_V != 0) {
      uVar4 = 0;
      lVar6 = (longdouble)1.79769313486232e+308;
      do {
        if (this->_K == 0) {
          dVar9 = 0.0;
        }
        else {
          dVar9 = 0.0;
          lVar3 = 0;
          uVar5 = 0;
          do {
            pol = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                    **)((long)&(((this->_nkv).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data + lVar3);
            local_60 = *(double *)(pol + uVar4 * 8) +
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4];
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_e0,(longdouble)local_60,in_RDX,pol);
            dVar10 = 0.0;
            piVar2 = extraout_RDX_11;
            lVar7 = in_ST1;
            lVar1 = in_ST3;
            if (lVar6 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar10 = (double)in_ST0;
              piVar2 = extraout_RDX_12;
              lVar7 = in_ST1;
              lVar1 = in_ST3;
              local_68 = dVar10;
            }
            in_ST3 = in_ST5;
            in_ST1 = lVar1;
            local_70 = (double)in_ST0;
            if (ABS(in_ST0) <= lVar6) {
              dVar10 = local_70;
            }
            lVar8 = in_ST3;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_e0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4],piVar2,pol);
            dVar11 = 0.0;
            in_RDX = extraout_RDX_13;
            in_ST0 = in_ST2;
            lVar1 = in_ST4;
            if (lVar6 < ABS(lVar7)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              dVar11 = (double)lVar7;
              in_RDX = extraout_RDX_14;
              in_ST0 = in_ST2;
              lVar1 = in_ST4;
              local_78 = dVar11;
            }
            in_ST4 = lVar8;
            in_ST2 = lVar1;
            local_80 = (double)lVar7;
            if (ABS(lVar7) <= lVar6) {
              dVar11 = local_80;
            }
            dVar9 = dVar9 + (dVar10 - dVar11) *
                            (this->_beta).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar4];
            uVar5 = uVar5 + 1;
            lVar3 = lVar3 + 0x18;
            in_ST5 = in_ST4;
          } while (uVar5 < this->_K);
        }
        (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar4] = dVar9 / local_f8;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->_V);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  return;
}

Assistant:

void VariationalBayesEstimatorOnATM::updateBeta(BetaUpdateManner manner){//{{{
    if(manner == SYMMETRY){
        double numerator=0;
        double denominator=0;
        for(int k=0;k<_K;k++){
            for(int v=0;v<_V;v++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v]) - boost::math::digamma(_beta[v]))*_beta[v];
            }
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        double commonBeta = numerator/denominator/_V;
        _beta.assign(_V, commonBeta);
    }else{
        double denominator=0;
        for(int k=0;k<_K;k++){
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        for(int v=0;v<_V;v++){
            double numerator=0;
            for(int k=0;k<_K;k++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v])-boost::math::digamma(_beta[v]))*_beta[v];
            }
            _beta[v] = numerator/denominator;
        }
    }
    _betaTimeSeries.push_back(_beta);
}